

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message1_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *message2_fields,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  pointer *ppSVar1;
  byte bVar2;
  MessageDifferencer *pMVar3;
  undefined1 uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 uVar7;
  SpecificField *pSVar8;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  *ppVar9;
  string *psVar11;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  ctrl_t *pcVar12;
  undefined7 uVar14;
  undefined7 extraout_var_02;
  string *extraout_RAX;
  string *psVar13;
  ulong uVar15;
  FieldDescriptor *pFVar16;
  long lVar17;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_00;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_01;
  anon_union_8_1_a8a14541_for_iterator_2 aVar18;
  anon_union_8_1_a8a14541_for_iterator_2 extraout_RDX_02;
  pointer pSVar19;
  undefined4 uVar20;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *this_00;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  Metadata MVar24;
  iterator iVar25;
  iterator iVar26;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  vStackY_f0;
  FieldDescriptor *field1;
  undefined4 local_a4;
  MessageDifferencer *local_a0;
  FieldDescriptor *field2;
  ulong local_90;
  long local_88;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
  *local_80;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_68;
  pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
  local_60;
  Reflection *local_48;
  Reflection *local_40;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_38;
  ulong uVar10;
  undefined7 extraout_var_01;
  
  local_38 = message2_fields;
  MVar24 = Message::GetMetadata(message1);
  local_40 = MVar24.reflection;
  MVar24 = Message::GetMetadata(message2);
  local_48 = MVar24.reflection;
  local_80 = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&this->force_compare_no_presence_fields_;
  local_70 = &this->force_compare_failure_triggering_fields_;
  uVar15 = 0;
  local_88 = 2;
  uVar20 = 0;
  local_a4 = 0;
  local_a0 = this;
  local_68 = message1_fields;
LAB_0031f1ca:
  field1 = *(message1_fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  field2 = (local_38->
           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           )._M_impl.super__Vector_impl_data._M_start[(int)uVar15];
  lVar17 = 3;
  if (field1 == (FieldDescriptor *)0x0 && field2 == (FieldDescriptor *)0x0) {
LAB_0031f1fe:
    uVar4 = (*(code *)((long)&DAT_004295a8 + (long)(int)(&DAT_004295a8)[lVar17]))(uVar20);
    return (bool)uVar4;
  }
  bVar22 = field1 != (FieldDescriptor *)0x0;
  if ((bVar22) && (field2 != (FieldDescriptor *)0x0)) {
    bVar22 = field1->number_ < field2->number_;
  }
  if (bVar22) {
    bVar22 = IsIgnored(this,message1,message2,field1,parent_fields);
    pFVar16 = field1;
    if (bVar22) {
      if (this->reporter_ != (Reporter *)0x0) {
        pSVar8 = PushSpecificField(parent_fields);
        pSVar8->message1 = message1;
        pSVar8->message2 = message2;
        pSVar8->unpacked_any = unpacked_any;
        pSVar8->field = field1;
        if (this->report_ignores_ == true) {
          (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
        }
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
      }
      uVar4 = (*(code *)((long)&DAT_004295a8 + (long)(int)(&DAT_004295a8)[local_88]))(1);
      return (bool)uVar4;
    }
    if (this->reporter_ == (Reporter *)0x0) {
LAB_0031f93e:
      lVar17 = 1;
      goto LAB_0031f1fe;
    }
    if (field1 == (FieldDescriptor *)0x0) goto LAB_0031f9e1;
    bVar2 = field1->field_0x1;
    bVar22 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar22) {
      psVar11 = (string *)0x0;
    }
    else {
      psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                          (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
    }
    local_90 = uVar15;
    if (psVar11 != (string *)0x0) goto LAB_0031f9d4;
    uVar5 = 1;
    uVar10 = 0;
    if ((pFVar16->field_0x1 & 0x20) != 0) {
      uVar5 = Reflection::FieldSize(local_40,message1,field1);
      uVar10 = (ulong)uVar5;
    }
    if ((int)uVar5 < 1) goto LAB_0031f579;
    uVar21 = 0;
    while( true ) {
      pSVar8 = PushSpecificField(parent_fields);
      pFVar16 = field1;
      pSVar8->message1 = message1;
      pSVar8->message2 = message2;
      pSVar8->unpacked_any = unpacked_any;
      pSVar8->field = field1;
      bVar2 = field1->field_0x1;
      bVar22 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar22) {
        psVar11 = (string *)0x0;
      }
      else {
        psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar11 != (string *)0x0) break;
      if ((pFVar16->field_0x1 & 0x20) == 0) {
        pSVar8->index = -1;
      }
      else {
        AddSpecificIndex(pSVar8,message1,field1,uVar21);
      }
      uVar6 = (*local_a0->reporter_->_vptr_Reporter[3])
                        (local_a0->reporter_,message1,message2,parent_fields);
      uVar10 = (ulong)uVar6;
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
      uVar21 = uVar21 + 1;
      if (uVar5 == uVar21) {
LAB_0031f579:
        local_a4 = (undefined4)CONCAT71((int7)(uVar10 >> 8),1);
        uVar4 = (*(code *)((long)&DAT_004295a8 + (long)(int)(&DAT_004295a8)[local_88]))(1);
        return (bool)uVar4;
      }
    }
    CompareWithFieldsInternal();
LAB_0031f9c7:
    CompareWithFieldsInternal();
LAB_0031f9d4:
    CompareWithFieldsInternal();
LAB_0031f9e1:
    __assert_fail("field1 != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                  ,0x365,
                  "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                 );
  }
  bVar22 = field2 != (FieldDescriptor *)0x0;
  if ((field1 != (FieldDescriptor *)0x0) && (field2 != (FieldDescriptor *)0x0)) {
    bVar22 = field2->number_ < field1->number_;
  }
  if (!bVar22) {
    bVar22 = IsIgnored(this,message1,message2,field1,parent_fields);
    if (bVar22) {
      if (this->reporter_ != (Reporter *)0x0) {
        pSVar8 = PushSpecificField(parent_fields);
        pSVar8->message1 = message1;
        pSVar8->message2 = message2;
        pSVar8->unpacked_any = unpacked_any;
        pSVar8->field = field1;
        if (this->report_ignores_ == true) {
          (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
        }
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
      }
      uVar4 = (*(code *)((long)&DAT_004295a8 + (long)(int)(&DAT_004295a8)[local_88]))(1);
      return (bool)uVar4;
    }
    if (field1 == (FieldDescriptor *)0x0) {
      __assert_fail("field1 != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc"
                    ,0x3d5,
                    "bool google::protobuf::util::MessageDifferencer::CompareWithFieldsInternal(const Message &, const Message &, int, const std::vector<const FieldDescriptor *> &, const std::vector<const FieldDescriptor *> &, std::vector<SpecificField> *)"
                   );
    }
    uVar14 = extraout_var;
    local_90 = uVar15;
    if ((field1->type_ == '\v') &&
       (bVar22 = FieldDescriptor::is_map_message_type(field1), uVar14 = extraout_var_00, bVar22)) {
      bVar22 = CompareMapField(this,message1,message2,unpacked_any,field1,parent_fields);
      pcVar12 = (ctrl_t *)CONCAT71(extraout_var_01,bVar22);
      aVar18 = extraout_RDX;
LAB_0031f85f:
      iVar25.field_1.slot_ = aVar18.slot_;
      iVar25.ctrl_ = pcVar12;
      bVar22 = SUB81(pcVar12,0);
    }
    else {
      pSVar19 = (pointer)field1;
      bVar2 = field1->field_0x1;
      uVar15 = CONCAT71(uVar14,bVar2) & 0xffffff20;
      bVar22 = (bool)((byte)uVar15 >> 5);
      pFVar16 = (FieldDescriptor *)CONCAT71((int7)(uVar15 >> 8),bVar22);
      if (0xbf < bVar2 == bVar22) {
        psVar11 = (string *)0x0;
      }
      else {
        psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      this = local_a0;
      if (psVar11 != (string *)0x0) {
        CompareWithFieldsInternal();
        psVar11 = extraout_RAX;
        goto LAB_0031fa2c;
      }
      if ((((FieldDescriptor *)pSVar19)->field_0x1 & 0x20) != 0) {
        bVar22 = CompareRepeatedField(local_a0,message1,message2,unpacked_any,field1,parent_fields);
        pcVar12 = (ctrl_t *)CONCAT71(extraout_var_02,bVar22);
        aVar18 = extraout_RDX_02;
        goto LAB_0031f85f;
      }
      vStackY_f0.
      super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x31f648;
      bVar22 = CompareFieldValueUsingParentFields
                         (local_a0,message1,message2,unpacked_any,field1,-1,-1,parent_fields);
      iVar25 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
               ::find<google::protobuf::FieldDescriptor_const*>(local_80,&field1);
      if (iVar25.ctrl_ != (ctrl_t *)0x0) {
        local_78 = local_70;
        ppVar9 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
                 ::EmplaceDecomposable::operator()
                           (&local_60,&local_78,field1->all_names_ + 1,field1->all_names_ + 1);
        iVar25.field_1.slot_ = extraout_RDX_00.slot_;
        iVar25.ctrl_ = (ctrl_t *)ppVar9;
      }
      if (this->reporter_ == (Reporter *)0x0) goto LAB_0031f911;
      pSVar8 = PushSpecificField(parent_fields);
      pSVar8->message1 = message1;
      pSVar8->message2 = message2;
      pSVar8->unpacked_any = unpacked_any;
      pSVar8->field = field1;
      if (this->force_compare_no_presence_ == true) {
        iVar25 = absl::lts_20240722::container_internal::
                 raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                 ::find<google::protobuf::FieldDescriptor_const*>(local_80,&field1);
        aVar18 = iVar25.field_1;
        bVar23 = iVar25.ctrl_ != (ctrl_t *)0x0;
        uVar14 = iVar25.ctrl_._1_7_;
      }
      else {
        bVar23 = false;
        uVar14 = 0;
        aVar18 = extraout_RDX_01;
      }
      this = local_a0;
      pSVar8->forced_compare_no_presence_ = bVar23;
      if (bVar22) {
        lVar17 = 0x30;
        iVar25.field_1.slot_ = aVar18.slot_;
        iVar25.ctrl_ = (ctrl_t *)0x30;
        if (local_a0->report_matches_ == true) goto LAB_0031f8f0;
      }
      else {
        local_a4 = (undefined4)CONCAT71(uVar14,1);
        lVar17 = 0x20;
LAB_0031f8f0:
        iVar25 = (iterator)
                 (**(code **)(lVar17 + (long)local_a0->reporter_->_vptr_Reporter))
                           (local_a0->reporter_,message1,message2,parent_fields);
      }
      ppSVar1 = &(parent_fields->
                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + -1;
    }
LAB_0031f911:
    uVar7 = local_a4;
    if ((bVar22 == false) &&
       (uVar7 = (int)CONCAT71(iVar25.ctrl_._1_7_,1), this->reporter_ == (Reporter *)0x0))
    goto LAB_0031f93e;
    uVar20 = 1;
    lVar17 = 0;
    local_a4 = uVar7;
    goto LAB_0031f1fe;
  }
  bVar22 = IsIgnored(this,message1,message2,field2,parent_fields);
  if (!bVar22) {
    iVar25 = absl::lts_20240722::container_internal::
             raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
             ::find<google::protobuf::FieldDescriptor_const*>(local_80,&field2);
    ppVar9 = (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
              *)iVar25.ctrl_;
    if (ppVar9 != (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator,_bool>
                   *)0x0) {
      local_78 = local_70;
      ppVar9 = absl::lts_20240722::container_internal::
               raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::__cxx11::string>>
               ::EmplaceDecomposable::operator()
                         (&local_60,&local_78,field2->all_names_ + 1,field2->all_names_ + 1);
    }
    pSVar19 = (pointer)field2;
    if (!bVar22) {
      if (local_a0->reporter_ == (Reporter *)0x0) {
        lVar17 = 1;
        goto LAB_0031f1fe;
      }
      bVar2 = field2->field_0x1;
      uVar10 = CONCAT71((int7)((ulong)ppVar9 >> 8),bVar2) & 0xffffff20;
      bVar22 = (bool)((byte)uVar10 >> 5);
      pFVar16 = (FieldDescriptor *)CONCAT71((int7)(uVar10 >> 8),bVar22);
      if (0xbf < bVar2 == bVar22) {
        psVar11 = (string *)0x0;
      }
      else {
        psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar11 != (string *)0x0) {
LAB_0031fa2c:
        ppVar9 = &local_60;
        CompareWithFieldsInternal();
        this_00 = &vStackY_f0;
        vStackY_f0.
        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar19;
        if ((ppVar9[0xf].field_0x17 == '\x01') &&
           (bVar22 = FieldDescriptor::has_presence(pFVar16), !bVar22)) {
          bVar2 = pFVar16->field_0x1;
          bVar22 = (bool)((bVar2 & 0x20) >> 5);
          if (0xbf < bVar2 == bVar22) {
            psVar13 = (string *)0x0;
          }
          else {
            psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                                (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
          }
          if (psVar13 != (string *)0x0) goto LAB_0031fb4c;
          if ((pFVar16->field_0x1 & 0x20) == 0) {
            return true;
          }
        }
        bVar2 = pFVar16->field_0x1;
        bVar22 = (bool)((bVar2 & 0x20) >> 5);
        if (0xbf < bVar2 == bVar22) {
          psVar13 = (string *)0x0;
        }
        else {
          psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
        }
        if (psVar13 == (string *)0x0) {
          if ((((pFVar16->field_0x1 & 0x20) != 0) ||
              (bVar22 = FieldDescriptor::has_presence(pFVar16), bVar22)) ||
             (8 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar16->type_ * 4) - 1U)) {
            bVar22 = false;
          }
          else {
            vStackY_f0.
            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            ._M_impl.super__Vector_impl_data._0_16_ =
                 TextFormat::Parser::UnsetFieldsMetadata::GetUnsetFieldId
                           ((Message *)psVar11,pFVar16);
            iVar26 = absl::lts_20240722::container_internal::
                     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                     ::
                     find<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>
                               ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>,std::allocator<std::pair<google::protobuf::Message_const*,google::protobuf::FieldDescriptor_const*>>>
                                 *)&ppVar9[4].second,
                                (key_arg<std::pair<const_google::protobuf::Message_*,_const_google::protobuf::FieldDescriptor_*>_>
                                 *)&vStackY_f0);
            bVar22 = iVar26.ctrl_ != (ctrl_t *)0x0;
          }
          return bVar22;
        }
        ShouldCompareNoPresence();
LAB_0031fb4c:
        ShouldCompareNoPresence();
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::emplace_back<>(this_00);
        return (bool)((char)(this_00->
                            super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -0x60);
      }
      uVar5 = 1;
      uVar10 = 0;
      local_90 = uVar15;
      if ((((FieldDescriptor *)pSVar19)->field_0x1 & 0x20) != 0) {
        uVar5 = Reflection::FieldSize(local_48,message2,field2);
        uVar10 = (ulong)uVar5;
      }
      if ((int)uVar5 < 1) goto LAB_0031f86b;
      uVar21 = 0;
      while( true ) {
        pSVar8 = PushSpecificField(parent_fields);
        pFVar16 = field2;
        pSVar8->message1 = message1;
        pSVar8->message2 = message2;
        pSVar8->unpacked_any = unpacked_any;
        pSVar8->field = field2;
        bVar2 = field2->field_0x1;
        bVar22 = (bool)((bVar2 & 0x20) >> 5);
        if (0xbf < bVar2 == bVar22) {
          psVar11 = (string *)0x0;
        }
        else {
          psVar11 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                              (bVar22,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
        }
        if (psVar11 != (string *)0x0) break;
        if ((pFVar16->field_0x1 & 0x20) == 0) {
          pSVar8->index = -1;
          pSVar8->new_index = -1;
        }
        else {
          pSVar8->index = uVar21;
          AddSpecificNewIndex(pSVar8,message2,field2,uVar21);
        }
        pMVar3 = local_a0;
        if (local_a0->force_compare_no_presence_ == true) {
          iVar25 = absl::lts_20240722::container_internal::
                   raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::FieldDescriptor_const*>,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<google::protobuf::FieldDescriptor_const*>>
                   ::find<google::protobuf::FieldDescriptor_const*>(local_80,&pSVar8->field);
          bVar22 = iVar25.ctrl_ != (ctrl_t *)0x0;
        }
        else {
          bVar22 = false;
        }
        pSVar8->forced_compare_no_presence_ = bVar22;
        uVar6 = (*pMVar3->reporter_->_vptr_Reporter[2])
                          (pMVar3->reporter_,message1,message2,parent_fields);
        uVar10 = (ulong)uVar6;
        ppSVar1 = &(parent_fields->
                   super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        uVar21 = uVar21 + 1;
        if (uVar5 == uVar21) {
LAB_0031f86b:
          local_a4 = (undefined4)CONCAT71((int7)(uVar10 >> 8),1);
          uVar4 = (*(code *)((long)&DAT_004295a8 + (long)(int)(&DAT_004295a8)[local_88]))(0);
          return (bool)uVar4;
        }
      }
      goto LAB_0031f9c7;
    }
  }
  this = local_a0;
  if (local_a0->reporter_ != (Reporter *)0x0) {
    pSVar8 = PushSpecificField(parent_fields);
    pSVar8->message1 = message1;
    pSVar8->message2 = message2;
    pSVar8->unpacked_any = unpacked_any;
    pSVar8->field = field2;
    if (this->report_ignores_ == true) {
      (*this->reporter_->_vptr_Reporter[7])(this->reporter_,message1,message2,parent_fields);
    }
    ppSVar1 = &(parent_fields->
               super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + -1;
  }
  uVar15 = (ulong)((int)uVar15 + 1);
  goto LAB_0031f1ca;
}

Assistant:

bool MessageDifferencer::CompareWithFieldsInternal(
    const Message& message1, const Message& message2, int unpacked_any,
    const std::vector<const FieldDescriptor*>& message1_fields,
    const std::vector<const FieldDescriptor*>& message2_fields,
    std::vector<SpecificField>* parent_fields) {
  bool isDifferent = false;
  int field_index1 = 0;
  int field_index2 = 0;

  const Reflection* reflection1 = message1.GetReflection();
  const Reflection* reflection2 = message2.GetReflection();

  while (true) {
    const FieldDescriptor* field1 = message1_fields[field_index1];
    const FieldDescriptor* field2 = message2_fields[field_index2];

    // Once we have reached sentinel values, we are done the comparison.
    if (field1 == NULL && field2 == NULL) {
      break;
    }

    // Check for differences in the field itself.
    if (FieldBefore(field1, field2)) {
      // Field 1 is not in the field list for message 2.
      if (IsIgnored(message1, message2, field1, *parent_fields)) {
        // We are ignoring field1. Report the ignore and move on to
        // the next field in message1_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index1;
        continue;
      }

      if (reporter_ != NULL) {
        assert(field1 != NULL);
        int count = field1->is_repeated()
                        ? reflection1->FieldSize(message1, field1)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field1;
          if (field1->is_repeated()) {
            AddSpecificIndex(&specific_field, message1, field1, i);
          } else {
            specific_field.index = -1;
          }

          reporter_->ReportDeleted(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index1;
      continue;
    } else if (FieldBefore(field2, field1)) {
      const bool ignore_field =
          IsIgnored(message1, message2, field2, *parent_fields);
      if (!ignore_field && force_compare_no_presence_fields_.contains(field2)) {
        force_compare_failure_triggering_fields_.emplace(field2->full_name());
      }

      // Field 2 is not in the field list for message 1.
      if (ignore_field) {
        // We are ignoring field2. Report the ignore and move on to
        // the next field in message2_fields.
        if (reporter_ != NULL) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1;
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (report_ignores_) {
            reporter_->ReportIgnored(message1, message2, *parent_fields);
          }
          parent_fields->pop_back();
        }
        ++field_index2;
        continue;
      }

      if (reporter_ != NULL) {
        int count = field2->is_repeated()
                        ? reflection2->FieldSize(message2, field2)
                        : 1;

        for (int i = 0; i < count; ++i) {
          SpecificField& specific_field = PushSpecificField(parent_fields);
          specific_field.message1 = &message1,
          specific_field.message2 = &message2;
          specific_field.unpacked_any = unpacked_any;
          specific_field.field = field2;
          if (field2->is_repeated()) {
            specific_field.index = i;
            AddSpecificNewIndex(&specific_field, message2, field2, i);
          } else {
            specific_field.index = -1;
            specific_field.new_index = -1;
          }

          specific_field.forced_compare_no_presence_ =
              force_compare_no_presence_ &&
              force_compare_no_presence_fields_.contains(specific_field.field);

          reporter_->ReportAdded(message1, message2, *parent_fields);
          parent_fields->pop_back();
        }

        isDifferent = true;
      } else {
        return false;
      }

      ++field_index2;
      continue;
    }

    // By this point, field1 and field2 are guaranteed to point to the same
    // field, so we can now compare the values.
    if (IsIgnored(message1, message2, field1, *parent_fields)) {
      // Ignore this field. Report and move on.
      if (reporter_ != NULL) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        if (report_ignores_) {
          reporter_->ReportIgnored(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }

      ++field_index1;
      ++field_index2;
      continue;
    }

    bool fieldDifferent = false;
    assert(field1 != NULL);
    if (field1->is_map()) {
      fieldDifferent = !CompareMapField(message1, message2, unpacked_any,
                                        field1, parent_fields);
    } else if (field1->is_repeated()) {
      fieldDifferent = !CompareRepeatedField(message1, message2, unpacked_any,
                                             field1, parent_fields);
    } else {
      fieldDifferent = !CompareFieldValueUsingParentFields(
          message1, message2, unpacked_any, field1, -1, -1, parent_fields);

      if (force_compare_no_presence_fields_.contains(field1)) {
        force_compare_failure_triggering_fields_.emplace(field1->full_name());
      }

      if (reporter_ != nullptr) {
        SpecificField& specific_field = PushSpecificField(parent_fields);
        specific_field.message1 = &message1;
        specific_field.message2 = &message2;
        specific_field.unpacked_any = unpacked_any;
        specific_field.field = field1;
        specific_field.forced_compare_no_presence_ =
            force_compare_no_presence_ &&
            force_compare_no_presence_fields_.contains(field1);

        if (fieldDifferent) {
          reporter_->ReportModified(message1, message2, *parent_fields);
          isDifferent = true;
        } else if (report_matches_) {
          reporter_->ReportMatched(message1, message2, *parent_fields);
        }
        parent_fields->pop_back();
      }
    }
    if (fieldDifferent) {
      if (reporter_ == nullptr) return false;
      isDifferent = true;
    }
    // Increment the field indices.
    ++field_index1;
    ++field_index2;
  }

  return !isDifferent;
}